

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall testing::Matcher<char>::Matcher(Matcher<char> *this,char value)

{
  linked_ptr<const_testing::MatcherInterface<char>_> local_38;
  
  (this->super_MatcherBase<char>).impl_.value_ = (MatcherInterface<char> *)0x0;
  (this->super_MatcherBase<char>).impl_.link_.next_ = &(this->super_MatcherBase<char>).impl_.link_;
  (this->super_MatcherBase<char>)._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001d6e88;
  local_38.value_ = (MatcherInterface<char> *)operator_new(0x10);
  ((local_38.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001d7048;
  *(char *)&local_38.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       value;
  local_38.link_.next_ = &local_38.link_;
  internal::linked_ptr<const_testing::MatcherInterface<char>_>::operator=
            (&(this->super_MatcherBase<char>).impl_,&local_38);
  internal::linked_ptr<const_testing::MatcherInterface<char>_>::~linked_ptr(&local_38);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }